

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontmetrics.cpp
# Opt level: O1

QRect __thiscall QFontMetrics::boundingRect(QFontMetrics *this,QString *text,QTextOption *option)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QStackTextEngine layout;
  undefined1 local_29e8 [12];
  QFixed QStack_29dc;
  undefined1 *local_29d8;
  QStackTextEngine local_29c8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((text->d).size == 0) {
    uVar6 = 0xffffffffffffffff;
    uVar5 = 0;
  }
  else {
    QFont::QFont((QFont *)local_29e8,(this->d).d.ptr);
    QStackTextEngine::QStackTextEngine(&local_29c8,text,(QFont *)local_29e8);
    QFont::~QFont((QFont *)local_29e8);
    QTextOption::operator=(&local_29c8.super_QTextEngine.option,option);
    QTextEngine::itemize(&local_29c8.super_QTextEngine);
    local_29d8 = &DAT_aaaaaaaaaaaaaaaa;
    local_29e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffd620 = &DAT_aaaaaaaaaaaaaaaa;
    QTextEngine::boundingBox
              ((glyph_metrics_t *)local_29e8,&local_29c8.super_QTextEngine,0,(int)(text->d).size);
    iVar4 = local_29e8._0_4_ + 0x20 >> 6;
    iVar3 = local_29e8._4_4_ + 0x20 >> 6;
    iVar1 = local_29e8._8_4_ + 0x20;
    iVar2 = QStack_29dc.val + 0x20;
    QTextEngine::LayoutData::~LayoutData(&local_29c8._layoutData);
    QTextEngine::~QTextEngine(&local_29c8.super_QTextEngine);
    uVar5 = CONCAT44(iVar3,iVar4);
    uVar6 = CONCAT44(iVar3 + (iVar2 >> 6) + -1,iVar4 + (iVar1 >> 6) + -1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar7.x2.m_i = (int)uVar6;
    QVar7.y2.m_i = (int)((ulong)uVar6 >> 0x20);
    QVar7.x1.m_i = (int)uVar5;
    QVar7.y1.m_i = (int)((ulong)uVar5 >> 0x20);
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QRect QFontMetrics::boundingRect(const QString &text, const QTextOption &option) const
{
    if (text.size() == 0)
        return QRect();

    Q_DECL_UNINITIALIZED QStackTextEngine layout(text, QFont(d.data()));
    layout.option = option;
    layout.itemize();
    glyph_metrics_t gm = layout.boundingBox(0, text.size());
    return QRect(qRound(gm.x), qRound(gm.y), qRound(gm.width), qRound(gm.height));
}